

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spanning_tree.cc
# Opt level: O2

void __thiscall VW::SpanningTree::SpanningTree(SpanningTree *this)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  ostream *poVar4;
  vw_exception *pvVar5;
  char *pcVar6;
  int on;
  string local_310;
  string local_2f0;
  string local_2d0;
  sockaddr_in address;
  stringstream __msg;
  ostream local_290 [376];
  char __errmsg [256];
  
  this->m_stop = false;
  this->port = 0x67af;
  this->m_future = (future<void> *)0x0;
  iVar1 = socket(2,1,0);
  this->sock = iVar1;
  if (iVar1 < 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
    poVar4 = local_290;
    std::operator<<(poVar4,"socket: ");
    piVar2 = __errno_location();
    pcVar6 = __errmsg;
    pcVar3 = strerror_r(*piVar2,pcVar6,0x100);
    if (pcVar3 == (char *)0x0) {
      poVar4 = std::operator<<(poVar4,"errno = ");
    }
    else {
      pcVar6 = "errno = unknown";
    }
    std::operator<<(poVar4,pcVar6);
    pvVar5 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    vw_exception::vw_exception
              (pvVar5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/spanning_tree.cc"
               ,0x5f,&local_2d0);
    __cxa_throw(pvVar5,&vw_exception::typeinfo,vw_exception::~vw_exception);
  }
  on = 1;
  iVar1 = setsockopt(iVar1,1,2,&on,4);
  if (-1 < iVar1) {
    address.sin_family = 2;
    address.sin_addr.s_addr = 0;
    address.sin_port = this->port << 8 | this->port >> 8;
    iVar1 = bind(this->sock,(sockaddr *)&address,0x10);
    if (-1 < iVar1) {
      return;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
    poVar4 = local_290;
    std::operator<<(poVar4,"bind: ");
    piVar2 = __errno_location();
    pcVar6 = __errmsg;
    pcVar3 = strerror_r(*piVar2,pcVar6,0x100);
    if (pcVar3 == (char *)0x0) {
      poVar4 = std::operator<<(poVar4,"errno = ");
    }
    else {
      pcVar6 = "errno = unknown";
    }
    std::operator<<(poVar4,pcVar6);
    pvVar5 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    vw_exception::vw_exception
              (pvVar5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/spanning_tree.cc"
               ,0x6b,&local_310);
    __cxa_throw(pvVar5,&vw_exception::typeinfo,vw_exception::~vw_exception);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
  poVar4 = local_290;
  std::operator<<(poVar4,"setsockopt SO_REUSEADDR: ");
  piVar2 = __errno_location();
  pcVar6 = __errmsg;
  pcVar3 = strerror_r(*piVar2,pcVar6,0x100);
  if (pcVar3 == (char *)0x0) {
    poVar4 = std::operator<<(poVar4,"errno = ");
  }
  else {
    pcVar6 = "errno = unknown";
  }
  std::operator<<(poVar4,pcVar6);
  pvVar5 = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  vw_exception::vw_exception
            (pvVar5,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/spanning_tree.cc"
             ,99,&local_2f0);
  __cxa_throw(pvVar5,&vw_exception::typeinfo,vw_exception::~vw_exception);
}

Assistant:

SpanningTree::SpanningTree() : m_stop(false), port(26543), m_future(nullptr)
{
#ifdef _WIN32
  WSAData wsaData;
  int lastError = WSAStartup(MAKEWORD(2, 2), &wsaData);
  if (lastError != 0)
    THROWERRNO("WSAStartup() returned error:" << lastError);
#endif

  sock = socket(PF_INET, SOCK_STREAM, 0);
  if (sock < 0)
    THROWERRNO("socket: ");

  int on = 1;
  if (setsockopt(sock, SOL_SOCKET, SO_REUSEADDR, (char*)&on, sizeof(on)) < 0)
    THROWERRNO("setsockopt SO_REUSEADDR: ");

  sockaddr_in address;
  address.sin_family = AF_INET;
  address.sin_addr.s_addr = htonl(INADDR_ANY);

  address.sin_port = htons(port);
  if (::bind(sock, (sockaddr*)&address, sizeof(address)) < 0)
    THROWERRNO("bind: ");
}